

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O3

void __thiscall ANN::initialize(ANN *this,double beg,double end)

{
  bool bVar1;
  time_t tVar2;
  pointer pLVar3;
  ulong uVar4;
  ulong uVar5;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pLVar3 != 0x58) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      Matrix::random_init(&pLVar3[uVar4].m_weights,beg,end);
      pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = uVar5 < ((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) *
                      0x2e8ba2e8ba2e8ba3 - 1U;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void ANN::initialize(double beg, double end){
    srand(time(0));
    for(uint i=0;i<m_layers.size()-1;++i){
        m_layers[i].weights().random_init(beg, end);
    }
}